

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O1

bool soul::TypeRules::canSilentlyCastTo(Type *dest,Value *value)

{
  Primitive PVar1;
  Primitive PVar2;
  bool bVar3;
  double dVar4;
  CastType CVar5;
  int32_t iVar6;
  ulong uVar7;
  int64_t iVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  double local_38;
  PackedData local_30;
  
  if ((dest->category == array) && (dest->boundingSize == 0)) {
    return false;
  }
  CVar5 = getCastType(dest,&value->type);
  if ((CVar5 - identity < 8) && ((0xebU >> (CVar5 - identity & 0x1f) & 1) != 0)) {
    return true;
  }
  if (((dest->category & ~primitive) == wrap) &&
     (((value->type).primitiveType.type - int32 < 2 ||
      (((value->type).category & ~primitive) == wrap)))) {
    soul::Value::getData(&local_30,value);
    uVar7 = soul::Value::PackedData::getAsInt64(&local_30);
    if ((dest->category & ~primitive) != wrap) {
      throwInternalCompilerError("isBoundedInt()","isValidBoundedIntIndex",0xb1);
    }
    return uVar7 < (ulong)(long)dest->boundingSize && -1 < (long)uVar7;
  }
  PVar1 = (dest->primitiveType).type;
  if (PVar1 == float32) {
    PVar2 = (value->type).primitiveType.type;
    if (PVar2 != float64) {
      if (1 < PVar2 - int32) goto LAB_001db02f;
LAB_001db0dd:
      fVar10 = soul::Value::getAsFloat(value);
      iVar6 = soul::Value::getAsInt32(value);
      fVar11 = (float)iVar6;
      goto LAB_001db0f9;
    }
    soul::Value::getData(&local_30,value);
    dVar4 = soul::Value::PackedData::getAsDouble(&local_30);
    local_38 = (double)(float)dVar4;
LAB_001db060:
    soul::Value::getData(&local_30,value);
    dVar4 = soul::Value::PackedData::getAsDouble(&local_30);
    uVar9 = SUB84(dVar4,0);
    uVar12 = (undefined4)((ulong)dVar4 >> 0x20);
  }
  else {
LAB_001db02f:
    if (PVar1 - int32 < 2) {
      PVar2 = (value->type).primitiveType.type;
      if (PVar2 != float32) {
        if (PVar2 == float64) {
          soul::Value::getData(&local_30,value);
          iVar8 = soul::Value::PackedData::getAsInt64(&local_30);
          local_38 = (double)(int)iVar8;
          goto LAB_001db060;
        }
        goto LAB_001db07f;
      }
      iVar6 = soul::Value::getAsInt32(value);
      fVar10 = (float)iVar6;
      fVar11 = soul::Value::getAsFloat(value);
LAB_001db0f9:
      bVar3 = fVar11 == fVar10;
      goto LAB_001db103;
    }
LAB_001db07f:
    if (PVar1 != complex32) {
      return false;
    }
    PVar1 = (value->type).primitiveType.type;
    if (PVar1 != float64) {
      if (1 < PVar1 - int32) {
        return false;
      }
      goto LAB_001db0dd;
    }
    fVar10 = soul::Value::getAsFloat(value);
    local_38 = (double)fVar10;
    dVar4 = soul::Value::getAsDouble(value);
    uVar9 = SUB84(dVar4,0);
    uVar12 = (undefined4)((ulong)dVar4 >> 0x20);
  }
  bVar3 = (double)CONCAT44(uVar12,uVar9) == local_38;
LAB_001db103:
  return (bool)(-bVar3 & 1);
}

Assistant:

static bool canSilentlyCastTo (const Type& dest, const Value& value)
    {
        const auto& type = value.getType();

        if (dest.isUnsizedArray())
            return false;

        if (canSilentlyCastTo (dest, type))
            return true;

        if (dest.isBoundedInt() && (type.isInteger() || type.isBoundedInt()))
            return dest.isValidBoundedIntIndex (value.getAsInt64());

        if (dest.isFloat32())
        {
            if (type.isFloat64())
                return static_cast<double> (value.getAsFloat()) == value.getAsDouble();

            if (type.isInteger())
                return value.getAsFloat() == static_cast<float> (value.getAsInt32());
        }

        if (dest.isInteger())
        {
            if (type.isFloat64())
                return value.getAsInt32() == value.getAsDouble();

            if (type.isFloat32())
                return static_cast<float> (value.getAsInt32()) == value.getAsFloat();
        }

        if (dest.isComplex32())
        {
            if (type.isFloat64())
                return static_cast<double> (value.getAsFloat()) == value.getAsDouble();

            if (type.isInteger())
                return value.getAsFloat() == static_cast<float> (value.getAsInt32());
        }

        return false;
    }